

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run.h
# Opt level: O3

int run_container_get_index(run_container_t *container,uint16_t x)

{
  ushort uVar1;
  ushort uVar2;
  uint uVar3;
  rle16_t *prVar4;
  int iVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  
  uVar3 = container->n_runs;
  if (0 < (int)uVar3) {
    prVar4 = container->runs;
    iVar5 = uVar3 - 1;
    uVar8 = 0;
    do {
      uVar7 = iVar5 + uVar8 >> 1;
      if (prVar4[uVar7].value < x) {
        uVar8 = uVar7 + 1;
      }
      else {
        if (prVar4[uVar7].value <= x) goto LAB_0011e953;
        iVar5 = uVar7 - 1;
      }
    } while ((int)uVar8 <= iVar5);
    if ((uVar8 != 0) &&
       ((int)((uint)x - (uint)prVar4[(ulong)uVar8 - 1].value) <=
        (int)(uint)prVar4[(ulong)uVar8 - 1].length)) {
LAB_0011e953:
      uVar6 = 0;
      iVar5 = 0;
      do {
        iVar9 = iVar5;
        uVar1 = prVar4[uVar6].value;
        uVar2 = prVar4[uVar6].length;
        if ((uint)x <= (uint)uVar2 + (uint)uVar1) {
          if (uVar1 <= x) {
            return (iVar9 + (uint)x) - (uint)uVar1;
          }
          return iVar9 + -1;
        }
        uVar6 = uVar6 + 1;
        iVar5 = iVar9 + (uint)uVar2 + 1;
      } while (uVar3 != uVar6);
      return iVar9 + (uint)uVar2;
    }
  }
  return -1;
}

Assistant:

inline bool run_container_contains(const run_container_t *run, uint16_t pos) {
    int32_t index = interleavedBinarySearch(run->runs, run->n_runs, pos);
    if (index >= 0) return true;
    index = -index - 2;  // points to preceding value, possibly -1
    if (index != -1) {   // possible match
        int32_t offset = pos - run->runs[index].value;
        int32_t le = run->runs[index].length;
        if (offset <= le) return true;
    }
    return false;
}